

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in.c
# Opt level: O3

LY_ERR ly_in_new_memory(char *str,ly_in **in)

{
  ly_in *plVar1;
  char *pcVar2;
  
  if (str == (char *)0x0) {
    pcVar2 = "str";
  }
  else {
    if (in != (ly_in **)0x0) {
      plVar1 = (ly_in *)calloc(1,0x40);
      *in = plVar1;
      if (plVar1 != (ly_in *)0x0) {
        plVar1->type = LY_IN_MEMORY;
        plVar1->func_start = str;
        plVar1->current = str;
        plVar1->start = str;
        plVar1->line = 1;
        return LY_SUCCESS;
      }
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_in_new_memory");
      return LY_EMEM;
    }
    pcVar2 = "in";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"ly_in_new_memory");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_in_new_memory(const char *str, struct ly_in **in)
{
    LY_CHECK_ARG_RET(NULL, str, in, LY_EINVAL);

    *in = calloc(1, sizeof **in);
    LY_CHECK_ERR_RET(!*in, LOGMEM(NULL), LY_EMEM);

    (*in)->type = LY_IN_MEMORY;
    (*in)->start = (*in)->current = (*in)->func_start = str;
    (*in)->line = 1;

    return LY_SUCCESS;
}